

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O2

void __thiscall QFileDialogPrivate::retranslateWindowTitle(QFileDialogPrivate *this)

{
  QWidget *this_00;
  qsizetype qVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  bool bVar4;
  AcceptMode AVar5;
  FileMode FVar6;
  char *s;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->useDefaultCaption == true) {
    this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
    QWidget::windowTitle((QString *)&local_48,this_00);
    bVar4 = ::operator!=(&this->setWindowTitle,(QString *)&local_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (!bVar4) {
      AVar5 = QFileDialog::acceptMode((QFileDialog *)this_00);
      if (AVar5 == AcceptOpen) {
        FVar6 = QFileDialog::fileMode((QFileDialog *)this_00);
        if (FVar6 == Directory) {
          s = "Find Directory";
        }
        else {
          s = "Open";
        }
      }
      else {
        s = "Save As";
      }
      QFileDialog::tr((QString *)&local_48,s,(char *)0x0,-1);
      QWidget::setWindowTitle(this_00,(QString *)&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
      QWidget::windowTitle((QString *)&local_48,this_00);
      pDVar2 = (this->setWindowTitle).d.d;
      pcVar3 = (this->setWindowTitle).d.ptr;
      (this->setWindowTitle).d.d = local_48.d;
      (this->setWindowTitle).d.ptr = local_48.ptr;
      qVar1 = (this->setWindowTitle).d.size;
      (this->setWindowTitle).d.size = local_48.size;
      local_48.d = pDVar2;
      local_48.ptr = pcVar3;
      local_48.size = qVar1;
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::retranslateWindowTitle()
{
    Q_Q(QFileDialog);
    if (!useDefaultCaption || setWindowTitle != q->windowTitle())
        return;
    if (q->acceptMode() == QFileDialog::AcceptOpen) {
        const QFileDialog::FileMode fileMode = q->fileMode();
        if (fileMode == QFileDialog::Directory)
            q->setWindowTitle(QFileDialog::tr("Find Directory"));
        else
            q->setWindowTitle(QFileDialog::tr("Open"));
    } else
        q->setWindowTitle(QFileDialog::tr("Save As"));

    setWindowTitle = q->windowTitle();
}